

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void * address_space_map_aarch64
                 (AddressSpace *as,hwaddr addr,hwaddr *plen,_Bool is_write,MemTxAttrs attrs)

{
  uc_struct_conflict12 *puVar1;
  uc_struct_conflict7 *puVar2;
  MemoryRegion *pMVar3;
  MemoryRegion *pMVar4;
  void *pvVar5;
  hwaddr done;
  hwaddr hVar6;
  ulong alignment;
  undefined1 lock;
  hwaddr *plen_00;
  hwaddr hVar7;
  hwaddr l;
  hwaddr xlat;
  hwaddr xlat_1;
  ulong local_70;
  hwaddr *local_68;
  hwaddr local_60;
  MemTxAttrs local_54;
  AddressSpace *local_50;
  FlatView *local_48;
  ram_addr_t local_40;
  hwaddr local_38;
  
  hVar7 = *plen;
  if (hVar7 == 0) {
    return (void *)0x0;
  }
  puVar1 = as->uc;
  plen_00 = &local_70;
  local_48 = as->current_map;
  local_70 = hVar7;
  local_68 = plen;
  local_54 = attrs;
  local_50 = as;
  pMVar3 = flatview_translate_aarch64
                     ((uc_struct_conflict2 *)as,local_48,addr,&local_40,plen_00,is_write,attrs);
  if ((is_write & pMVar3->ram) == 1) {
    if (pMVar3->readonly != false) {
LAB_005d8d5f:
      alignment = (ulong)-puVar1->init_target_page->mask;
      if (alignment <= local_70) {
        local_70 = alignment;
      }
      pvVar5 = qemu_memalign(alignment,local_70);
      puVar2 = pMVar3->uc;
      (puVar2->bounce).buffer = pvVar5;
      (puVar2->bounce).addr = addr;
      (puVar2->bounce).len = local_70;
      (puVar2->bounce).mr = (MemoryRegion_conflict *)pMVar3;
      if (!is_write) {
        flatview_read((uc_struct_conflict2 *)local_50->uc,local_48,addr,(MemTxAttrs)0x1,pvVar5,
                      local_70);
        pvVar5 = (pMVar3->uc->bounce).buffer;
      }
      *local_68 = local_70;
      return pvVar5;
    }
  }
  else if ((!is_write & pMVar3->ram) == 0) goto LAB_005d8d5f;
  local_60 = local_70;
  hVar6 = 0;
  while( true ) {
    lock = SUB81(plen_00,0);
    hVar6 = hVar6 + local_60;
    hVar7 = hVar7 - local_60;
    if (hVar7 == 0) break;
    addr = addr + local_60;
    plen_00 = &local_60;
    local_60 = hVar7;
    pMVar4 = flatview_translate_aarch64
                       ((uc_struct_conflict2 *)as,local_48,addr,&local_38,plen_00,is_write,local_54)
    ;
    lock = SUB81(plen_00,0);
    if ((pMVar4 != pMVar3) || (local_38 != local_40 + hVar6)) break;
  }
  *local_68 = hVar6;
  pvVar5 = qemu_ram_ptr_length((uc_struct_conflict2 *)local_50->uc,pMVar3->ram_block,local_40,
                               local_68,(_Bool)lock);
  return pvVar5;
}

Assistant:

void *address_space_map(AddressSpace *as,
                        hwaddr addr,
                        hwaddr *plen,
                        bool is_write,
                        MemTxAttrs attrs)
{
    hwaddr len = *plen;
    hwaddr l, xlat;
    MemoryRegion *mr;
    void *ptr;
    FlatView *fv;
    struct uc_struct *uc = as->uc;

    if (len == 0) {
        return NULL;
    }

    l = len;
    fv = address_space_to_flatview(as);
    mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);

    if (!memory_access_is_direct(mr, is_write)) {
        /* Avoid unbounded allocations */
        l = MIN(l, TARGET_PAGE_SIZE);
        mr->uc->bounce.buffer = qemu_memalign(TARGET_PAGE_SIZE, l);
        mr->uc->bounce.addr = addr;
        mr->uc->bounce.len = l;

        mr->uc->bounce.mr = mr;
        if (!is_write) {
            flatview_read(as->uc, fv, addr, MEMTXATTRS_UNSPECIFIED,
                               mr->uc->bounce.buffer, l);
        }

        *plen = l;
        return mr->uc->bounce.buffer;
    }


    *plen = flatview_extend_translation(as->uc, fv, addr, len, mr, xlat,
                                        l, is_write, attrs);
    ptr = qemu_ram_ptr_length(as->uc, mr->ram_block, xlat, plen, true);

    return ptr;
}